

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AgenPeeps.cpp
# Opt level: O2

int __thiscall
AgenPeeps::MoveInstrUp(AgenPeeps *this,Instr *instrToMove,Instr *blockStart,int bound)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Instr *pIVar4;
  int iVar5;
  
  bVar2 = LowererMD::IsAssign(instrToMove);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/AgenPeeps.cpp"
                       ,0x51,"(LowererMD::IsAssign(instrToMove))",
                       "We only reschedule move instructions for now");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  iVar5 = 0;
  if (instrToMove != blockStart) {
    pIVar4 = IR::Instr::GetPrevRealInstr(instrToMove);
    bVar2 = DependentInstrs(this,instrToMove,pIVar4);
    if (!bVar2) {
      pIVar4 = IR::Instr::GetPrevRealInstr(instrToMove);
      IR::Instr::Unlink(instrToMove);
      iVar5 = 1;
      while (bVar2 = DependentInstrs(this,instrToMove,pIVar4), !bVar2) {
        if ((pIVar4 == blockStart) || (0 < bound && bound == iVar5)) {
          IR::Instr::InsertBefore(pIVar4,instrToMove);
          return iVar5;
        }
        pIVar4 = IR::Instr::GetPrevRealInstr(pIVar4);
        iVar5 = iVar5 + 1;
      }
      IR::Instr::InsertAfter(pIVar4,instrToMove);
      iVar5 = iVar5 + -1;
    }
  }
  return iVar5;
}

Assistant:

int AgenPeeps::MoveInstrUp(IR::Instr *instrToMove, IR::Instr *blockStart, int bound)
{
    AssertMsg(LowererMD::IsAssign(instrToMove), "We only reschedule move instructions for now");
    IR::Instr *instr;
    int i = 1;
    if (instrToMove == blockStart || DependentInstrs(instrToMove, instrToMove->GetPrevRealInstr()))
        return 0;

    instr = instrToMove->GetPrevRealInstr();
    instrToMove->Unlink();

    while (!DependentInstrs(instrToMove, instr))
    {
        if (instr == blockStart || (bound > 0 && i == bound))
        {
            instr->InsertBefore(instrToMove);
            return i;
        }
        instr = instr->GetPrevRealInstr();
        i++;
    }
    // Insert after dependent instruction
    instr->InsertAfter(instrToMove);

    return i - 1;
}